

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall QDockWidgetGroupWindow::updateCurrentGapRect(QDockWidgetGroupWindow *this)

{
  QLayout *pQVar1;
  QDockAreaLayoutInfo *this_00;
  iterator iVar2;
  QRect QVar3;
  
  if (*(long *)(this + 0x48) != 0) {
    pQVar1 = QWidget::layout((QWidget *)this);
    this_00 = QDockAreaLayoutInfo::info
                        ((QDockAreaLayoutInfo *)&pQVar1[4].super_QLayoutItem,
                         (QList<int> *)(this + 0x38));
    iVar2 = QList<int>::end((QList<int> *)(this + 0x38));
    QVar3 = QDockAreaLayoutInfo::itemRect(this_00,iVar2.i[-1],true);
    *(QRect *)(this + 0x28) = QVar3;
  }
  return;
}

Assistant:

constexpr bool isEmpty() const noexcept { return size() == 0; }